

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O3

quint16 qChecksum(QByteArrayView data,ChecksumType standard)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  ushort uVar4;
  
  uVar1 = 0x6363;
  if (standard != ChecksumItuV41) {
    uVar1 = 0;
  }
  uVar1 = -(uint)(standard == ChecksumIso3309) | uVar1;
  uVar4 = (ushort)uVar1;
  uVar2 = (ulong)uVar1;
  if (data.m_size != 0) {
    lVar3 = 0;
    do {
      uVar4 = (ushort)((uVar2 & 0xffff) >> 4) ^
              crc_tbl[((uint)uVar2 ^ (uint)(byte)data.m_data[lVar3]) & 0xf];
      uVar4 = uVar4 >> 4 ^ crc_tbl[uVar4 & 0xf ^ (uint)((byte)data.m_data[lVar3] >> 4)];
      uVar2 = (ulong)uVar4;
      lVar3 = lVar3 + 1;
    } while (data.m_size != lVar3);
  }
  return uVar4 ^ -(ushort)(standard == ChecksumIso3309);
}

Assistant:

quint16 qChecksum(QByteArrayView data, Qt::ChecksumType standard)
{
    quint16 crc = 0x0000;
    switch (standard) {
    case Qt::ChecksumIso3309:
        crc = 0xffff;
        break;
    case Qt::ChecksumItuV41:
        crc = 0x6363;
        break;
    }
    uchar c;
    const uchar *p = reinterpret_cast<const uchar *>(data.data());
    qsizetype len = data.size();
    while (len--) {
        c = *p++;
        crc = ((crc >> 4) & 0x0fff) ^ crc_tbl[((crc ^ c) & 15)];
        c >>= 4;
        crc = ((crc >> 4) & 0x0fff) ^ crc_tbl[((crc ^ c) & 15)];
    }
    switch (standard) {
    case Qt::ChecksumIso3309:
        crc = ~crc;
        break;
    case Qt::ChecksumItuV41:
        break;
    }
    return crc & 0xffff;
}